

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,string_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  uint hex;
  maybe<char,_void> *pmVar1;
  bool bVar2;
  int iVar3;
  state state;
  uint8_t *puVar4;
  error_code *err;
  __tuple_element_t<0UL,_tuple<state,_error_code>_> *p_Var5;
  __tuple_element_t<1UL,_tuple<state,_error_code>_> *p_Var6;
  char32_t *pcVar7;
  tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>
  *ptVar8;
  __tuple_element_t<0UL,_tuple<unsigned_int,_state>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<unsigned_int,_state>_> *p_Var10;
  bool local_e1;
  void *local_e0;
  error_code local_d8;
  __tuple_element_t<1UL,_tuple<unsigned_int,_state>_> local_c8;
  undefined4 local_c4;
  state next_state;
  undefined1 local_ac [8];
  maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
  hex_resl;
  undefined1 local_90 [8];
  tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_pstore::json::error_code>
  escape_resl;
  tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
  normal_resl;
  maybe<char32_t,_void> local_4c;
  maybe<char32_t,_void> code_point;
  error_code local_38;
  maybe<char,_void> *local_28;
  maybe<char,_void> *ch_local;
  parser<callbacks_proxy<mock_json_callbacks>_> *parser_local;
  string_matcher<callbacks_proxy<mock_json_callbacks>_> *this_local;
  
  local_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<callbacks_proxy<mock_json_callbacks>_> *)this;
  this_local = (string_matcher<callbacks_proxy<mock_json_callbacks>_> *)__return_storage_ptr__;
  bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
  pmVar1 = ch_local;
  if (bVar2) {
    puVar4 = (uint8_t *)maybe<char,_void>::operator*(ch);
    utf::utf8_decoder::get(&local_4c,&this->decoder_,*puVar4);
    bVar2 = maybe::operator_cast_to_bool((maybe *)&local_4c);
    if (bVar2) {
      iVar3 = matcher<callbacks_proxy<mock_json_callbacks>_>::get_state
                        (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>);
      pmVar1 = ch_local;
      switch(iVar3) {
      case 1:
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x476);
      case 2:
        pcVar7 = maybe<char32_t,_void>::operator*(&local_4c);
        pmVar1 = ch_local;
        if (*pcVar7 == L'\"') {
          bVar2 = appender::has_high_surrogate(&this->app_);
          if (bVar2) {
            assert_failed("!app_.has_high_surrogate ()",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                          ,0x44a);
          }
          matcher<callbacks_proxy<mock_json_callbacks>_>::set_state
                    (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,3);
        }
        else {
          std::error_code::error_code<pstore::json::error_code,void>
                    ((error_code *)
                     &normal_resl.
                      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
                      .
                      super__Head_base<0UL,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_false>
                     ,expected_token);
          matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                    (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
                     (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,
                     (error_code *)
                     &normal_resl.
                      super__Tuple_impl<0UL,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
                      .
                      super__Head_base<0UL,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_false>
                    );
        }
        break;
      case 3:
        pcVar7 = maybe<char32_t,_void>::operator*(&local_4c);
        consume_normal_state
                  ((tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
                    *)&escape_resl,this,(parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,
                   *pcVar7,&this->app_);
        p_Var5 = std::
                 get<0ul,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state,std::error_code>
                           ((tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
                             *)&escape_resl);
        matcher<callbacks_proxy<mock_json_callbacks>_>::set_state
                  (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,*p_Var5);
        pmVar1 = ch_local;
        err = std::
              get<std::error_code,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state,std::error_code>
                        ((tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_std::error_code>
                          *)&escape_resl);
        matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                  (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
                   (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,err);
        break;
      case 4:
        pcVar7 = maybe<char32_t,_void>::operator*(&local_4c);
        consume_escape_state
                  ((string_matcher<callbacks_proxy<mock_json_callbacks>_> *)local_90,*pcVar7,
                   &this->app_);
        p_Var5 = std::
                 get<0ul,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state,pstore::json::error_code>
                           ((tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_pstore::json::error_code>
                             *)local_90);
        matcher<callbacks_proxy<mock_json_callbacks>_>::set_state
                  (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,*p_Var5);
        pmVar1 = ch_local;
        p_Var6 = std::
                 get<1ul,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state,pstore::json::error_code>
                           ((tuple<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state,_pstore::json::error_code>
                             *)local_90);
        std::error_code::error_code<pstore::json::error_code,void>
                  ((error_code *)&hex_resl.storage_.__align,*p_Var6);
        matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                  (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
                   (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,
                   (error_code *)&hex_resl.storage_.__align);
        break;
      case 5:
        this->hex_ = 0;
      case 6:
      case 7:
      case 8:
        hex = this->hex_;
        state = matcher<callbacks_proxy<mock_json_callbacks>_>::get_state
                          (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>);
        pcVar7 = maybe<char32_t,_void>::operator*(&local_4c);
        consume_hex_state((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                           *)local_ac,hex,state,*pcVar7);
        bVar2 = maybe::operator_cast_to_bool((maybe *)local_ac);
        pmVar1 = ch_local;
        if (bVar2) {
          ptVar8 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                   ::operator*((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                                *)local_ac);
          p_Var9 = std::
                   get<0ul,unsigned_int,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state>
                             (ptVar8);
          this->hex_ = *p_Var9;
          ptVar8 = maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                   ::operator*((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                                *)local_ac);
          p_Var10 = std::
                    get<1ul,unsigned_int,pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>::state>
                              (ptVar8);
          local_c8 = *p_Var10;
          matcher<callbacks_proxy<mock_json_callbacks>_>::set_state
                    (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,local_c8);
          if ((local_c8 == normal_char_state) &&
             (bVar2 = appender::append16(&this->app_,(char16_t)this->hex_), pmVar1 = ch_local,
             !bVar2)) {
            std::error_code::error_code<pstore::json::error_code,void>
                      (&local_d8,bad_unicode_code_point);
            matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                      (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
                       (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,&local_d8);
          }
          local_c4 = 0;
        }
        else {
          std::error_code::error_code<pstore::json::error_code,void>
                    ((error_code *)&next_state,invalid_hex_char);
          matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
                    (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
                     (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,
                     (error_code *)&next_state);
          local_c4 = 2;
        }
        maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
        ::~maybe((maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::state>,_void>
                  *)local_ac);
      }
    }
    maybe<char32_t,_void>::~maybe(&local_4c);
    local_e0 = (void *)0x0;
    local_e1 = true;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_e0,&local_e1);
  }
  else {
    std::error_code::error_code<pstore::json::error_code,void>(&local_38,expected_close_quote);
    matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
              (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,
               (parser<callbacks_proxy<mock_json_callbacks>_> *)pmVar1,&local_38);
    stack0xffffffffffffffc0 = 0;
    code_point._3_1_ = 1;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>
              (__return_storage_ptr__,(void **)&code_point.storage_,(bool *)&code_point.field_0x3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            string_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_close_quote);
                    return {nullptr, true};
                }

                if (maybe<char32_t> const code_point =
                        decoder_.get (static_cast<std::uint8_t> (*ch))) {
                    switch (this->get_state ()) {
                    // Matches the opening quote.
                    case start_state:
                        if (*code_point == '"') {
                            PSTORE_ASSERT (!app_.has_high_surrogate ());
                            this->set_state (normal_char_state);
                        } else {
                            this->set_error (parser, error_code::expected_token);
                        }
                        break;
                    case normal_char_state: {
                        auto const normal_resl =
                            string_matcher::consume_normal_state (parser, *code_point, app_);
                        this->set_state (std::get<0> (normal_resl));
                        this->set_error (parser, std::get<std::error_code> (normal_resl));
                    } break;

                    case escape_state: {
                        auto const escape_resl =
                            string_matcher::consume_escape_state (*code_point, app_);
                        this->set_state (std::get<0> (escape_resl));
                        this->set_error (parser, std::get<1> (escape_resl));
                    } break;

                    case hex1_state: hex_ = 0; PSTORE_FALLTHROUGH;
                    case hex2_state:
                    case hex3_state:
                    case hex4_state: {
                        maybe<std::tuple<unsigned, state>> const hex_resl =
                            string_matcher::consume_hex_state (
                                hex_, static_cast<state> (this->get_state ()), *code_point);
                        if (!hex_resl) {
                            this->set_error (parser, error_code::invalid_hex_char);
                            break;
                        }
                        hex_ = std::get<0> (*hex_resl);
                        state const next_state = std::get<1> (*hex_resl);
                        this->set_state (next_state);
                        // We're done with the hex characters and are switching back to the "normal"
                        // state. The means that we can add the accumulated code-point (in hex_) to
                        // the string.
                        if (next_state == normal_char_state) {
                            if (!app_.append16 (static_cast<char16_t> (hex_))) {
                                this->set_error (parser, error_code::bad_unicode_code_point);
                            }
                        }
                    } break;

                    case done_state: PSTORE_ASSERT (false); break;
                    }
                }
                return {nullptr, true};
            }